

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,string *attribute)

{
  ostream *poVar1;
  XmlEncode XStack_48;
  
  if ((name->_M_string_length != 0) && (attribute->_M_string_length != 0)) {
    poVar1 = std::operator<<(this->m_os," ");
    poVar1 = std::operator<<(poVar1,(string *)name);
    poVar1 = std::operator<<(poVar1,"=\"");
    std::__cxx11::string::string((string *)&XStack_48,(string *)attribute);
    XStack_48.m_forWhat = ForAttributes;
    XmlEncode::encodeTo(&XStack_48,poVar1);
    std::operator<<(poVar1,"\"");
    std::__cxx11::string::~string((string *)&XStack_48);
  }
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, std::string const& attribute ) {
            if( !name.empty() && !attribute.empty() )
                stream() << " " << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << "\"";
            return *this;
        }